

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deprecation-warning.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  char *__s;
  long lVar1;
  string filename;
  long *local_68;
  char *local_60;
  long local_58 [2];
  long *local_48 [2];
  long local_38 [2];
  
  local_68 = local_58;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"main","");
  if (0 < argc) {
    __s = *argv;
    strlen(__s);
    std::__cxx11::string::_M_replace((ulong)&local_68,0,local_60,(ulong)__s);
  }
  lVar1 = std::__cxx11::string::find_last_of((char *)&local_68,0x102009,0xffffffffffffffff);
  if (lVar1 != -1) {
    std::__cxx11::string::substr((ulong)local_48,(ulong)&local_68);
    std::__cxx11::string::operator=((string *)&local_68,(string *)local_48);
    if (local_48[0] != local_38) {
      operator_delete(local_48[0],local_38[0] + 1);
    }
  }
  fputc(10,_stdout);
  fprintf(_stdout,"WARNING: The binary \'%s\' is deprecated.\n",local_68);
  fwrite("Please use \'llama-mtmd-cli\' instead.\n",0x25,1,_stdout);
  fputc(10,_stdout);
  if (local_68 != local_58) {
    operator_delete(local_68,local_58[0] + 1);
  }
  return 1;
}

Assistant:

int main(int argc, char** argv) {
    std::string filename = "main";
    if (argc >= 1) {
        filename = argv[0];
    }

    // Get only the program name from the full path
    size_t pos = filename.find_last_of("/\\");
    if (pos != std::string::npos) {
        filename = filename.substr(pos+1);
    }

    fprintf(stdout, "\n");
    fprintf(stdout, "WARNING: The binary '%s' is deprecated.\n", filename.c_str());
    fprintf(stdout, "Please use 'llama-mtmd-cli' instead.\n");
    fprintf(stdout, "\n");

    return EXIT_FAILURE;
}